

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompRelativeLocationPath(xmlXPathParserContextPtr ctxt)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  
  pbVar2 = ctxt->cur;
  while( true ) {
    pbVar1 = pbVar2 + 1;
    uVar3 = (ulong)*pbVar2;
    if (0x2f < uVar3) break;
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0x2f) {
        if (*pbVar1 == 0x2f) goto LAB_001c8e38;
        if (*pbVar2 == 0x2f) {
          while( true ) {
            ctxt->cur = pbVar1;
            if ((0x20 < (ulong)*pbVar1) || ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0))
            break;
            pbVar1 = pbVar1 + 1;
          }
        }
      }
      break;
    }
    ctxt->cur = pbVar1;
    pbVar2 = pbVar1;
  }
  goto LAB_001c8e9f;
  while ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0) {
LAB_001c8e38:
    pbVar1 = pbVar1 + 1;
    ctxt->cur = pbVar1;
    if (0x20 < (ulong)*pbVar1) break;
  }
  xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001c8e9f:
  xmlXPathCompStep(ctxt);
  if (ctxt->error == 0) {
    pbVar2 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar2 + 1;
      pbVar2 = pbVar2 + 1;
    }
    while (pbVar2 = ctxt->cur, *pbVar2 == 0x2f) {
      if (pbVar2[1] == 0x2f) {
        pbVar2 = pbVar2 + 2;
        while( true ) {
          ctxt->cur = pbVar2;
          if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))
          break;
          pbVar2 = pbVar2 + 1;
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
      }
      else {
        do {
          pbVar2 = pbVar2 + 1;
          ctxt->cur = pbVar2;
          if (0x20 < (ulong)*pbVar2) break;
        } while ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0);
      }
      xmlXPathCompStep(ctxt);
      pbVar2 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar2 + 1;
        pbVar2 = pbVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompRelativeLocationPath
(xmlXPathParserContextPtr ctxt) {
    SKIP_BLANKS;
    if ((CUR == '/') && (NXT(1) == '/')) {
	SKIP(2);
	SKIP_BLANKS;
	PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		         NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
    } else if (CUR == '/') {
	    NEXT;
	SKIP_BLANKS;
    }
    xmlXPathCompStep(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while (CUR == '/') {
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;
	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
			     NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
	    xmlXPathCompStep(ctxt);
	} else if (CUR == '/') {
	    NEXT;
	    SKIP_BLANKS;
	    xmlXPathCompStep(ctxt);
	}
	SKIP_BLANKS;
    }
}